

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

void __thiscall TTD::TTEventList::AddArrayLink(TTEventList *this)

{
  TTEventListLink *pTVar1;
  TTEventListLink *pTVar2;
  byte *__s;
  
  pTVar2 = (TTEventListLink *)SlabAllocatorBase<8>::SlabAllocateTypeRawSize<40ul>(this->m_alloc);
  __s = SlabAllocatorBase<8>::SlabAllocateLargeBlockSize<true>(this->m_alloc,0x10000);
  pTVar2->BlockData = __s;
  memset(__s,0,0x10000);
  pTVar2->Next = (TTEventListLink *)0x0;
  pTVar2->CurrPos = 0;
  pTVar2->StartPos = 0;
  pTVar1 = this->m_headBlock;
  pTVar2->Previous = pTVar1;
  if (pTVar1 != (TTEventListLink *)0x0) {
    pTVar1->Next = pTVar2;
  }
  this->m_headBlock = pTVar2;
  return;
}

Assistant:

void TTEventList::AddArrayLink()
    {
        TTEventListLink* newHeadBlock = this->m_alloc->SlabAllocateStruct<TTEventListLink>();
        newHeadBlock->BlockData = this->m_alloc->SlabAllocateFixedSizeArray<byte, TTD_EVENTLOG_LIST_BLOCK_SIZE>();
        memset(newHeadBlock->BlockData, 0, TTD_EVENTLOG_LIST_BLOCK_SIZE);

        newHeadBlock->CurrPos = 0;
        newHeadBlock->StartPos = 0;

        newHeadBlock->Next = nullptr;
        newHeadBlock->Previous = this->m_headBlock;

        if(this->m_headBlock != nullptr)
        {
            this->m_headBlock->Next = newHeadBlock;
        }

        this->m_headBlock = newHeadBlock;
    }